

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-graph.h
# Opt level: O0

bool __thiscall wasm::LazyLocalGraph::isSSA(LazyLocalGraph *this,Index index)

{
  bool bVar1;
  size_type sVar2;
  pointer ppVar3;
  _Node_iterator_base<std::pair<const_unsigned_int,_bool>,_false> _Stack_30;
  bool ret;
  _Node_iterator_base<std::pair<const_unsigned_int,_bool>,_false> local_28;
  iterator iter;
  Index index_local;
  LazyLocalGraph *this_local;
  
  iter.super__Node_iterator_base<std::pair<const_unsigned_int,_bool>,_false>._M_cur._4_4_ = index;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_bool,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
       ::find(&this->SSAIndexes,
              (key_type *)
              ((long)&iter.super__Node_iterator_base<std::pair<const_unsigned_int,_bool>,_false>.
                      _M_cur + 4));
  _Stack_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_bool,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
       ::end(&this->SSAIndexes);
  bVar1 = std::__detail::operator==(&local_28,&stack0xffffffffffffffd0);
  if (bVar1) {
    this_local._7_1_ =
         computeSSA(this,iter.super__Node_iterator_base<std::pair<const_unsigned_int,_bool>,_false>.
                         _M_cur._4_4_);
    sVar2 = std::
            unordered_map<unsigned_int,_bool,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
            ::count(&this->SSAIndexes,
                    (key_type *)
                    ((long)&iter.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_bool>,_false>.
                            _M_cur + 4));
    if (sVar2 == 0) {
      __assert_fail("SSAIndexes.count(index)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/local-graph.h"
                    ,0xdd,"bool wasm::LazyLocalGraph::isSSA(Index) const");
    }
  }
  else {
    ppVar3 = std::__detail::_Node_iterator<std::pair<const_unsigned_int,_bool>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_unsigned_int,_bool>,_false,_false> *)
                        &local_28);
    this_local._7_1_ = (bool)(ppVar3->second & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool isSSA(Index index) const {
    auto iter = SSAIndexes.find(index);
    if (iter == SSAIndexes.end()) {
      auto ret = computeSSA(index);
      // The result must have been memoized.
      assert(SSAIndexes.count(index));
      return ret;
    }
    return iter->second;
  }